

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_gprq(Pixel *out,Pixel *in,Background *back)

{
  int fixed_srgb;
  png_uint_16 pVar1;
  uint uVar2;
  double dVar3;
  
  fixed_srgb = in->r;
  if (fixed_srgb == in->b && in->g == fixed_srgb) {
    pVar1 = ilineara(fixed_srgb,in->a);
    uVar2 = (uint)pVar1;
  }
  else {
    dVar3 = floor((sRGB_to_d[in->b] * 0.0722 +
                  sRGB_to_d[fixed_srgb] * 0.2126 + sRGB_to_d[in->g] * 0.7152) *
                  (double)(in->a * 0x101) + 0.5);
    uVar2 = (uint)dVar3;
  }
  uVar2 = uVar2 & 0xffff;
  out->b = uVar2;
  out->g = uVar2;
  out->r = uVar2;
  out->a = 0xffff;
  return;
}

Assistant:

static void
gpc_gprq(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->r == in->g && in->g == in->b)
      out->r = out->g = out->b = ilineara(in->g, in->a);

   else
      out->r = out->g = out->b = u16d(in->a * 257 *
         YfromRGB(sRGB_to_d[in->r], sRGB_to_d[in->g], sRGB_to_d[in->b]));

   out->a = 65535;
}